

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_io_device.cpp
# Opt level: O0

void __thiscall
booster::aio::basic_io_device::set_non_blocking(basic_io_device *this,bool nonblocking)

{
  error_code eVar1;
  bool bVar2;
  undefined8 uVar3;
  error_code *in_RDI;
  error_code e;
  system_error *in_stack_ffffffffffffffc0;
  error_code *in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffdf;
  basic_io_device *in_stack_ffffffffffffffe0;
  error_category *peStack_18;
  
  std::error_code::error_code(in_RDI);
  set_non_blocking(in_stack_ffffffffffffffe0,(bool)in_stack_ffffffffffffffdf,
                   in_stack_ffffffffffffffd0);
  bVar2 = std::error_code::operator_cast_to_bool((error_code *)&stack0xffffffffffffffe0);
  if (!bVar2) {
    return;
  }
  uVar3 = __cxa_allocate_exception(0x40);
  eVar1._M_cat = peStack_18;
  eVar1._0_8_ = in_stack_ffffffffffffffe0;
  system::system_error::system_error(in_stack_ffffffffffffffc0,eVar1);
  __cxa_throw(uVar3,&system::system_error::typeinfo,system::system_error::~system_error);
}

Assistant:

void basic_io_device::set_non_blocking(bool nonblocking)
{
	system::error_code e;
	set_non_blocking(nonblocking,e);
	if(e) throw system::system_error(e);
}